

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
          (Roaring64MapSetBitBiDirectionalIterator *this,Roaring64Map *parent,bool exhausted)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  undefined3 in_register_00000011;
  
  this->p = &parent->roarings;
  (this->map_iter)._M_node = (_Base_ptr)0x0;
  (this->i).parent = (roaring_bitmap_t *)0x0;
  *(undefined8 *)((long)&(this->i).parent + 1) = 0;
  *(undefined8 *)((long)&(this->i).container + 1) = 0;
  (this->i).container_index = 0;
  (this->i).highbits = 0;
  (this->i).container_it = 0;
  (this->i).current_value = 0;
  (this->i).has_value = false;
  if ((CONCAT31(in_register_00000011,exhausted) == 0) &&
     ((parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var1 = (parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->map_iter)._M_node = p_Var1;
    roaring_iterator_init
              ((roaring_bitmap_t *)&p_Var1[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
    if ((this->i).has_value == false) {
      do {
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment((this->map_iter)._M_node);
        (this->map_iter)._M_node = p_Var2;
        if ((_Rb_tree_header *)p_Var2 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
          return;
        }
        roaring_iterator_init
                  ((roaring_bitmap_t *)&p_Var2[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
      } while ((this->i).has_value != true);
    }
  }
  else {
    (this->map_iter)._M_node = &(parent->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  return;
}

Assistant:

Roaring64MapSetBitBiDirectionalIterator(const Roaring64Map &parent,
                                            bool exhausted = false)
        : p(&parent.roarings) {
        if (exhausted || parent.roarings.empty()) {
            map_iter = p->cend();
        } else {
            map_iter = parent.roarings.cbegin();
            roaring_iterator_init(&map_iter->second.roaring, &i);
            while (!i.has_value) {
                map_iter++;
                if (map_iter == p->cend()) return;
                roaring_iterator_init(&map_iter->second.roaring, &i);
            }
        }
    }